

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itoa.h
# Opt level: O3

char * rapidjson::internal::u32toa(uint32_t value,char *buffer)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (9999 < value) {
    if (99999999 < value) {
      uVar4 = (ulong)value / 100000000;
      uVar2 = value + (int)uVar4 * -100000000;
      if (value < 1000000000) {
        *buffer = (byte)((ulong)value / 100000000) | 0x30;
        pcVar1 = buffer + 1;
      }
      else {
        *(undefined2 *)buffer = *(undefined2 *)(GetDigitsLut()::cDigitsLut + uVar4 * 2);
        pcVar1 = buffer + 2;
      }
      *(undefined2 *)pcVar1 =
           *(undefined2 *)(GetDigitsLut()::cDigitsLut + (uVar2 / 500000 & 0xfffffffe));
      *(undefined2 *)(pcVar1 + 2) =
           *(undefined2 *)
            (GetDigitsLut()::cDigitsLut +
            (ulong)(uVar2 / 10000 + ((uVar2 / 10000 & 0xffff) / 100) * -100 & 0xffff) * 2);
      *(undefined2 *)(pcVar1 + 4) =
           *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)((uVar2 % 10000) / 100) * 2);
      *(undefined2 *)(pcVar1 + 6) =
           *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)((uVar2 % 10000) % 100) * 2);
      return pcVar1 + 8;
    }
    uVar5 = (ulong)(value / 500000 & 0xfffffffe);
    uVar2 = (value / 10000 + ((value / 10000 & 0xffff) / 100) * -100 & 0xffff) * 2;
    uVar4 = (ulong)(((value % 10000) / 100) * 2);
    uVar3 = ((value % 10000) % 100) * 2;
    if (value < 10000000) {
      if (999999 < value) goto LAB_0036fc12;
      if (value < 100000) goto LAB_0036fc38;
    }
    else {
      *buffer = GetDigitsLut()::cDigitsLut[uVar5];
      buffer = buffer + 1;
LAB_0036fc12:
      *buffer = GetDigitsLut()::cDigitsLut[uVar5 + 1];
      buffer = buffer + 1;
    }
    *buffer = GetDigitsLut()::cDigitsLut[uVar2];
    buffer = buffer + 1;
LAB_0036fc38:
    *buffer = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar2 + 1];
    buffer[1] = GetDigitsLut()::cDigitsLut[uVar4];
    buffer[2] = GetDigitsLut()::cDigitsLut[uVar4 + 1];
    buffer[3] = GetDigitsLut()::cDigitsLut[uVar3];
    buffer[4] = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar3 + 1];
    return buffer + 5;
  }
  uVar3 = (value & 0xffff) / 100;
  uVar2 = uVar3 * 2;
  uVar3 = (value + uVar3 * -100 & 0xffff) * 2;
  if (value < 1000) {
    if (99 < value) goto LAB_0036fb97;
    if (value < 10) goto LAB_0036fbb9;
  }
  else {
    *buffer = GetDigitsLut()::cDigitsLut[uVar2];
    buffer = buffer + 1;
LAB_0036fb97:
    *buffer = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar2 + 1];
    buffer = buffer + 1;
  }
  *buffer = GetDigitsLut()::cDigitsLut[uVar3];
  buffer = buffer + 1;
LAB_0036fbb9:
  *buffer = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar3 + 1];
  return buffer + 1;
}

Assistant:

inline char* u32toa(uint32_t value, char* buffer) {
    const char* cDigitsLut = GetDigitsLut();

    if (value < 10000) {
        const uint32_t d1 = (value / 100) << 1;
        const uint32_t d2 = (value % 100) << 1;
        
        if (value >= 1000)
            *buffer++ = cDigitsLut[d1];
        if (value >= 100)
            *buffer++ = cDigitsLut[d1 + 1];
        if (value >= 10)
            *buffer++ = cDigitsLut[d2];
        *buffer++ = cDigitsLut[d2 + 1];
    }
    else if (value < 100000000) {
        // value = bbbbcccc
        const uint32_t b = value / 10000;
        const uint32_t c = value % 10000;
        
        const uint32_t d1 = (b / 100) << 1;
        const uint32_t d2 = (b % 100) << 1;
        
        const uint32_t d3 = (c / 100) << 1;
        const uint32_t d4 = (c % 100) << 1;
        
        if (value >= 10000000)
            *buffer++ = cDigitsLut[d1];
        if (value >= 1000000)
            *buffer++ = cDigitsLut[d1 + 1];
        if (value >= 100000)
            *buffer++ = cDigitsLut[d2];
        *buffer++ = cDigitsLut[d2 + 1];
        
        *buffer++ = cDigitsLut[d3];
        *buffer++ = cDigitsLut[d3 + 1];
        *buffer++ = cDigitsLut[d4];
        *buffer++ = cDigitsLut[d4 + 1];
    }
    else {
        // value = aabbbbcccc in decimal
        
        const uint32_t a = value / 100000000; // 1 to 42
        value %= 100000000;
        
        if (a >= 10) {
            const unsigned i = a << 1;
            *buffer++ = cDigitsLut[i];
            *buffer++ = cDigitsLut[i + 1];
        }
        else
            *buffer++ = static_cast<char>('0' + static_cast<char>(a));

        const uint32_t b = value / 10000; // 0 to 9999
        const uint32_t c = value % 10000; // 0 to 9999
        
        const uint32_t d1 = (b / 100) << 1;
        const uint32_t d2 = (b % 100) << 1;
        
        const uint32_t d3 = (c / 100) << 1;
        const uint32_t d4 = (c % 100) << 1;
        
        *buffer++ = cDigitsLut[d1];
        *buffer++ = cDigitsLut[d1 + 1];
        *buffer++ = cDigitsLut[d2];
        *buffer++ = cDigitsLut[d2 + 1];
        *buffer++ = cDigitsLut[d3];
        *buffer++ = cDigitsLut[d3 + 1];
        *buffer++ = cDigitsLut[d4];
        *buffer++ = cDigitsLut[d4 + 1];
    }
    return buffer;
}